

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_polycurve.cpp
# Opt level: O0

bool __thiscall ON_PolyCurve::IsNested(ON_PolyCurve *this)

{
  int iVar1;
  ON_Curve **ppOVar2;
  ON_PolyCurve *pOVar3;
  int local_1c;
  int count;
  int i;
  ON_PolyCurve *this_local;
  
  iVar1 = ON_SimpleArray<ON_Curve_*>::Count(&(this->m_segment).super_ON_SimpleArray<ON_Curve_*>);
  local_1c = 0;
  while( true ) {
    if (iVar1 <= local_1c) {
      return false;
    }
    ppOVar2 = ON_SimpleArray<ON_Curve_*>::operator[]
                        (&(this->m_segment).super_ON_SimpleArray<ON_Curve_*>,local_1c);
    pOVar3 = Cast((ON_Object *)*ppOVar2);
    if (pOVar3 != (ON_PolyCurve *)0x0) break;
    local_1c = local_1c + 1;
  }
  return true;
}

Assistant:

bool ON_PolyCurve::IsNested() const
{
  int i, count = m_segment.Count();
	for ( i = 0; i < count; i++ )
  {
    if (  ON_PolyCurve::Cast(m_segment[i]) )
      return true;
  }
  return false;
}